

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O2

void aec_get_rsi_msb_16(aec_stream *strm)

{
  ushort uVar1;
  uint32_t *puVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar2 = strm->state->data_raw;
  puVar3 = strm->next_in;
  uVar4 = strm->block_size * strm->rsi;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = *(ushort *)(puVar3 + uVar5 * 2);
    puVar2[uVar5] = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  strm->next_in = puVar3 + (int)(uVar4 * 2);
  strm->avail_in = strm->avail_in - (long)(int)(uVar4 * 2);
  return;
}

Assistant:

void aec_get_rsi_msb_16(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[2 * i] << 8) | (uint32_t)in[2 * i + 1];

    strm->next_in += 2 * rsi;
    strm->avail_in -= 2 * rsi;
}